

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

int __thiscall TMndxMarFile::DoSearch(TMndxMarFile *this,TMndxSearch *pSearch,bool *pbFindResult)

{
  TFileNameDatabase *this_00;
  bool bVar1;
  int iVar2;
  TStruct40 *pTVar3;
  
  this_00 = this->pDatabase;
  if (this_00 == (TFileNameDatabase *)0x0) {
    iVar2 = 0x16;
  }
  else {
    if (pSearch->pStruct40 == (TStruct40 *)0x0) {
      pTVar3 = (TStruct40 *)operator_new(0x40);
      (pTVar3->PathStops).ItemArray = (TPathStop *)0x0;
      (pTVar3->PathStops).ItemCount = 0;
      (pTVar3->PathStops).MaxItemCount = 0;
      (pTVar3->PathStops).bIsValidArray = false;
      (pTVar3->PathBuffer).ItemArray = (char *)0x0;
      (pTVar3->PathBuffer).ItemCount = 0;
      (pTVar3->PathBuffer).MaxItemCount = 0;
      (pTVar3->PathBuffer).bIsValidArray = false;
      pTVar3->NodeIndex = 0;
      pTVar3->PathLength = 0;
      pTVar3->ItemCount = 0;
      pTVar3->SearchPhase = 0;
      pSearch->pStruct40 = pTVar3;
    }
    bVar1 = TFileNameDatabase::DoSearch(this_00,pSearch);
    *pbFindResult = bVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int DoSearch(TMndxSearch * pSearch, bool * pbFindResult)
    {
        int nError = ERROR_SUCCESS;

        if(pDatabase == NULL)
            return ERROR_INVALID_PARAMETER;

        // Create the pStruct40, if not initialized yet
        if(pSearch->pStruct40 == NULL)
        {
            nError = pSearch->CreateStruct40();
            if(nError != ERROR_SUCCESS)
                return nError;
        }

        *pbFindResult = pDatabase->DoSearch(pSearch);
        return nError;
    }